

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanohttp.c
# Opt level: O2

int xmlNanoHTTPRead(void *ctx,void *dest,int len)

{
  int iVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  void *__src;
  xmlNanoHTTPCtxtPtr ctxt;
  long *plVar6;
  
  if (dest == (void *)0x0 || ctx == (void *)0x0) {
    return -1;
  }
  iVar3 = 0;
  if (0 < len) {
    if (*(int *)((long)ctx + 0xa8) == 1) {
      plVar6 = *(long **)((long)ctx + 0xa0);
      if (plVar6 != (long *)0x0) {
        plVar6[3] = (long)dest;
        *(int *)(plVar6 + 4) = len;
        iVar3 = *(int *)((long)ctx + 0x50) - *(int *)((long)ctx + 0x58);
        *(int *)(plVar6 + 1) = iVar3;
        iVar5 = 0;
        do {
          if ((int)plVar6[4] == 0) break;
          if (iVar3 == 0) {
            iVar3 = xmlNanoHTTPRecv((xmlNanoHTTPCtxtPtr)ctx);
            plVar6 = *(long **)((long)ctx + 0xa0);
            if (iVar3 < 1) break;
          }
          lVar2 = *(long *)((long)ctx + 0x58);
          iVar4 = (*(int *)((long)ctx + 0x50) - iVar5) - (int)lVar2;
          *(int *)(plVar6 + 1) = iVar4;
          *plVar6 = lVar2 + iVar5;
          iVar1 = inflate(plVar6,0);
          plVar6 = *(long **)((long)ctx + 0xa0);
          iVar3 = (int)plVar6[1];
          iVar5 = (iVar4 - iVar3) + iVar5;
        } while (iVar1 == 0);
        *(long *)((long)ctx + 0x58) = *(long *)((long)ctx + 0x58) + (long)iVar5;
        iVar3 = len - (int)plVar6[4];
      }
    }
    else {
      do {
        __src = *(void **)((long)ctx + 0x58);
        lVar2 = *(long *)((long)ctx + 0x50) - (long)__src;
        if ((long)(ulong)(uint)len <= lVar2) goto LAB_00155f82;
        iVar3 = xmlNanoHTTPRecv((xmlNanoHTTPCtxtPtr)ctx);
      } while (0 < iVar3);
      __src = *(void **)((long)ctx + 0x58);
      lVar2 = *(long *)((long)ctx + 0x50) - (long)__src;
LAB_00155f82:
      iVar3 = len;
      if (lVar2 < (long)(ulong)(uint)len) {
        iVar3 = (int)lVar2;
      }
      memcpy(dest,__src,(long)iVar3);
      *(long *)((long)ctx + 0x58) = *(long *)((long)ctx + 0x58) + (long)iVar3;
    }
  }
  return iVar3;
}

Assistant:

int
xmlNanoHTTPRead(void *ctx, void *dest, int len) {
    xmlNanoHTTPCtxtPtr ctxt = (xmlNanoHTTPCtxtPtr) ctx;
#ifdef LIBXML_ZLIB_ENABLED
    int bytes_read = 0;
    int orig_avail_in;
    int z_ret;
#endif

    if (ctx == NULL) return(-1);
    if (dest == NULL) return(-1);
    if (len <= 0) return(0);

#ifdef LIBXML_ZLIB_ENABLED
    if (ctxt->usesGzip == 1) {
        if (ctxt->strm == NULL) return(0);

        ctxt->strm->next_out = dest;
        ctxt->strm->avail_out = len;
	ctxt->strm->avail_in = ctxt->inptr - ctxt->inrptr;

        while (ctxt->strm->avail_out > 0 &&
	       (ctxt->strm->avail_in > 0 || xmlNanoHTTPRecv(ctxt) > 0)) {
            orig_avail_in = ctxt->strm->avail_in =
			    ctxt->inptr - ctxt->inrptr - bytes_read;
            ctxt->strm->next_in = BAD_CAST (ctxt->inrptr + bytes_read);

            z_ret = inflate(ctxt->strm, Z_NO_FLUSH);
            bytes_read += orig_avail_in - ctxt->strm->avail_in;

            if (z_ret != Z_OK) break;
	}

        ctxt->inrptr += bytes_read;
        return(len - ctxt->strm->avail_out);
    }
#endif

    while (ctxt->inptr - ctxt->inrptr < len) {
        if (xmlNanoHTTPRecv(ctxt) <= 0) break;
    }
    if (ctxt->inptr - ctxt->inrptr < len)
        len = ctxt->inptr - ctxt->inrptr;
    memcpy(dest, ctxt->inrptr, len);
    ctxt->inrptr += len;
    return(len);
}